

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjComputePathR(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int i;
  
  iVar1 = Acb_ObjIsCo(p,iObj);
  if (iVar1 == 0) {
    i = 0;
    iVar1 = 0;
    while( true ) {
      pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
      if (pVVar5->nSize <= i) break;
      pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar2 = Vec_IntEntry(pVVar5,i);
      AVar3 = Acb_ObjType(p,iVar2);
      if (AVar3 != ABC_OPER_NONE) {
        iVar4 = Acb_ObjSlack(p,iVar2);
        if (iVar4 == 0) {
          iVar2 = Acb_ObjPathR(p,iVar2);
          iVar1 = iVar1 + iVar2;
        }
      }
      i = i + 1;
    }
    Vec_IntWriteEntry(&p->vPathR,iObj,iVar1);
    return iVar1;
  }
  __assert_fail("!Acb_ObjIsCo(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                ,0x1c2,"int Acb_ObjComputePathR(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjComputePathR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Path = 0;
    assert( !Acb_ObjIsCo(p, iObj) );
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        if ( !Acb_ObjSlack(p, iFanout) )
            Path += Acb_ObjPathR(p, iFanout);
    return Acb_ObjSetPathR( p, iObj, Path );
}